

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O0

void __thiscall
Symbol_table::define_name(Symbol_table *this,string *name,double value,bool is_const)

{
  bool bVar1;
  string local_b0;
  Variable local_90;
  allocator<char> local_49;
  string local_48;
  byte local_21;
  double dStack_20;
  bool is_const_local;
  double value_local;
  string *name_local;
  Symbol_table *this_local;
  
  local_21 = is_const;
  dStack_20 = value;
  value_local = (double)name;
  name_local = (string *)this;
  bVar1 = is_declared(this,name);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"redeclaration of variable",&local_49);
    error(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  std::__cxx11::string::string((string *)&local_b0,(string *)value_local);
  Variable::Variable(&local_90,&local_b0,dStack_20,(bool)(local_21 & 1));
  std::vector<Variable,_std::allocator<Variable>_>::push_back
            ((vector<Variable,_std::allocator<Variable>_> *)this,&local_90);
  Variable::~Variable(&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void Symbol_table::define_name(const string& name, double value, bool is_const = false)
{
	if (is_declared(name))
		error("redeclaration of variable");
	var_table.push_back(Variable(name, value, is_const));
}